

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O1

void __thiscall
boost::unordered::
unordered_flat_set<std::pair<unsigned_int,unsigned_int>,slang::hash<std::pair<unsigned_int,unsigned_int>,void>,std::equal_to<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
::insert<std::pair<unsigned_int,unsigned_int>const*>
          (unordered_flat_set<std::pair<unsigned_int,unsigned_int>,slang::hash<std::pair<unsigned_int,unsigned_int>,void>,std::equal_to<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
           *this,pair<unsigned_int,_unsigned_int> *first,pair<unsigned_int,_unsigned_int> *last)

{
  char *pcVar1;
  undefined4 uVar2;
  uint uVar3;
  ulong pos0;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  undefined1 auVar14 [16];
  locator res;
  locator local_48;
  
  if (first != last) {
    do {
      auVar14 = ZEXT416(first->first) * ZEXT816(0x9e3779b97f4a7c15);
      uVar5 = (auVar14._8_8_ ^ auVar14._0_8_) + 0x9e3779b9;
      auVar14 = ZEXT416(first->second) * ZEXT816(0x9e3779b97f4a7c15);
      uVar5 = (auVar14._8_8_ ^ auVar14._0_8_) + 0x9e3779b9 + uVar5 * 0x40 + (uVar5 >> 2) ^ uVar5;
      pos0 = uVar5 >> ((byte)*this & 0x3f);
      uVar2 = (&detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
                match_word(unsigned_long)::word)[uVar5 & 0xff];
      uVar7 = 0;
      uVar9 = pos0;
      do {
        pcVar1 = (char *)(*(long *)(this + 0x10) + uVar9 * 0x10);
        cVar10 = (char)uVar2;
        auVar14[0] = -(*pcVar1 == cVar10);
        cVar11 = (char)((uint)uVar2 >> 8);
        auVar14[1] = -(pcVar1[1] == cVar11);
        cVar12 = (char)((uint)uVar2 >> 0x10);
        auVar14[2] = -(pcVar1[2] == cVar12);
        cVar13 = (char)((uint)uVar2 >> 0x18);
        auVar14[3] = -(pcVar1[3] == cVar13);
        auVar14[4] = -(pcVar1[4] == cVar10);
        auVar14[5] = -(pcVar1[5] == cVar11);
        auVar14[6] = -(pcVar1[6] == cVar12);
        auVar14[7] = -(pcVar1[7] == cVar13);
        auVar14[8] = -(pcVar1[8] == cVar10);
        auVar14[9] = -(pcVar1[9] == cVar11);
        auVar14[10] = -(pcVar1[10] == cVar12);
        auVar14[0xb] = -(pcVar1[0xb] == cVar13);
        auVar14[0xc] = -(pcVar1[0xc] == cVar10);
        auVar14[0xd] = -(pcVar1[0xd] == cVar11);
        auVar14[0xe] = -(pcVar1[0xe] == cVar12);
        auVar14[0xf] = -(pcVar1[0xf] == cVar13);
        uVar4 = (uint)(ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                               (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                               (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                               (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                               (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                               (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                               (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                               (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                               (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                               (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                               (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                               (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                               (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                               (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe);
        if (uVar4 != 0) {
          lVar8 = *(long *)(this + 0x18) + uVar9 * 0x78;
          do {
            uVar3 = 0;
            if (uVar4 != 0) {
              for (; (uVar4 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
              }
            }
            uVar6 = (ulong)uVar3;
            if (*(uint *)(lVar8 + 4 + uVar6 * 8) == first->second &&
                *(uint *)(lVar8 + uVar6 * 8) == first->first) {
              lVar8 = lVar8 + uVar6 * 8;
              goto LAB_00203b4f;
            }
            uVar4 = uVar4 - 1 & uVar4;
          } while (uVar4 != 0);
        }
        if ((*(byte *)(uVar9 * 0x10 + *(long *)(this + 0x10) + 0xf) &
            (&detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
              is_not_overflowed(unsigned_long)::shift)[(uint)uVar5 & 7]) == 0) break;
        lVar8 = uVar9 + uVar7;
        uVar7 = uVar7 + 1;
        uVar9 = lVar8 + 1U & *(ulong *)(this + 8);
      } while (uVar7 <= *(ulong *)(this + 8));
      lVar8 = 0;
LAB_00203b4f:
      if (lVar8 == 0) {
        if (*(ulong *)(this + 0x28) < *(ulong *)(this + 0x20)) {
          detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,unsigned_int>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::pair<unsigned_int,unsigned_int>,void>,std::equal_to<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
          ::nosize_unchecked_emplace_at<std::pair<unsigned_int,unsigned_int>const&>
                    (&local_48,
                     (table_core<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,unsigned_int>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::pair<unsigned_int,unsigned_int>,void>,std::equal_to<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                      *)this,(arrays_type *)this,pos0,uVar5,first);
          *(long *)(this + 0x28) = *(long *)(this + 0x28) + 1;
        }
        else {
          detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,unsigned_int>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::pair<unsigned_int,unsigned_int>,void>,std::equal_to<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
          ::unchecked_emplace_with_rehash<std::pair<unsigned_int,unsigned_int>const&>
                    (&local_48,
                     (table_core<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,unsigned_int>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::pair<unsigned_int,unsigned_int>,void>,std::equal_to<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                      *)this,uVar5,first);
        }
      }
      first = first + 1;
    } while (first != last);
  }
  return;
}

Assistant:

void insert(InputIterator first, InputIterator last) {
        for (auto pos = first; pos != last; ++pos) {
            table_.emplace(*pos);
        }
    }